

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void __thiscall ObjectBlockPool<32,_2048>::Reset(ObjectBlockPool<32,_2048> *this)

{
  LargeBlock<32,_2048> *pLVar1;
  MyLargeBlock *following;
  ObjectBlockPool<32,_2048> *this_local;
  
  if (this->activePages != (MyLargeBlock *)0x0) {
    do {
      pLVar1 = this->activePages->next;
      NULLC::alignedDealloc(this->activePages);
      this->activePages = pLVar1;
    } while (this->activePages != (MyLargeBlock *)0x0);
    this->freeBlocks = &this->lastBlock;
    this->activePages = (MyLargeBlock *)0x0;
    this->lastNum = 0x800;
    FastVector<LargeBlock<32,_2048>_*,_false,_false>::reset(&this->sortedPages);
    FastVector<SmallBlock<32>_*,_false,_false>::reset(&this->objectsToFinalize);
    FastVector<SmallBlock<32>_*,_false,_false>::reset(&this->objectsToFree);
  }
  return;
}

Assistant:

void Reset()
	{
		if(!activePages)
			return;
		do
		{
			MyLargeBlock* following = activePages->next;
			NULLC::alignedDealloc(activePages);
			activePages = following;
		}while(activePages != NULL);

		freeBlocks = &lastBlock;
		activePages = NULL;
		lastNum = countInBlock;

		sortedPages.reset();
		objectsToFinalize.reset();
		objectsToFree.reset();
	}